

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

void polymul_internal::polynomial_multiplier<double,_2,_1,_3>::mul_monomial
               (double *dst,double *p1,double *m2)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = binomial(5,3);
  pdVar2 = dst + iVar1;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      pdVar2[lVar4] = p1[lVar3 + 1] * m2[lVar4] + pdVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pdVar2 = pdVar2 + 1;
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  polynomial_multiplier<double,_2,_0,_3>::mul_monomial(dst,p1,m2);
  return;
}

Assistant:

static void mul_monomial(numtype POLYMUL_RESTRICT dst[],
                           const numtype p1[],
                           const numtype m2[]) {
    polynomial_multiplier<numtype, Nvar - 1, Ndeg1, Ndeg2>::mul(
        dst + binomial(Nvar + Ndeg1 + Ndeg2 - 1, Ndeg1 + Ndeg2 - 1),
        p1 + binomial(Nvar + Ndeg1 - 1, Ndeg1 - 1),
        m2);
    polynomial_multiplier<numtype, Nvar, Ndeg1 - 1, Ndeg2>::mul_monomial(
        dst, p1, m2);
  }